

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeadArgumentElimination.cpp
# Opt level: O0

void __thiscall wasm::DAEScanner::~DAEScanner(DAEScanner *this)

{
  DAEScanner *this_local;
  
  ~DAEScanner(this);
  operator_delete(this,0x120);
  return;
}

Assistant:

bool isFunctionParallel() override { return true; }